

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O0

string * __thiscall
CLI::Timer::make_time_str_abi_cxx11_(string *__return_storage_ptr__,Timer *this,double time)

{
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  anon_class_1_0_00000001 local_21;
  double dStack_20;
  anon_class_1_0_00000001 print_it;
  double time_local;
  Timer *this_local;
  
  dStack_20 = time;
  if (1e-06 <= time) {
    if (0.001 <= time) {
      if (1.0 <= time) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_d0,"s",&local_d1);
        make_time_str::anon_class_1_0_00000001::operator()
                  (__return_storage_ptr__,&local_21,time,&local_d0);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_a8,"ms",&local_a9);
        make_time_str::anon_class_1_0_00000001::operator()
                  (__return_storage_ptr__,&local_21,time * 1000.0,&local_a8);
        ::std::__cxx11::string::~string((string *)&local_a8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_80,"us",&local_81);
      make_time_str::anon_class_1_0_00000001::operator()
                (__return_storage_ptr__,&local_21,time * 1000000.0,&local_80);
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_48,"ns",&local_49);
    make_time_str::anon_class_1_0_00000001::operator()
              (__return_storage_ptr__,&local_21,time * 1000000000.0,&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_time_str(double time) const {
        auto print_it = [](double x, std::string unit) {
            char buffer[50];
            std::snprintf(buffer, 50, "%.5g", x);
            return buffer + std::string(" ") + unit;
        };

        if(time < .000001)
            return print_it(time * 1000000000, "ns");
        else if(time < .001)
            return print_it(time * 1000000, "us");
        else if(time < 1)
            return print_it(time * 1000, "ms");
        else
            return print_it(time, "s");
    }